

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.h
# Opt level: O0

void __thiscall TPZMHMeshControl::TPZMHMeshControl(TPZMHMeshControl *this,int dimension)

{
  TPZGeoMesh *pTVar1;
  int in_ESI;
  undefined8 *in_RDI;
  bool in_stack_00000047;
  TPZAutoPointer<TPZGeoMesh> *in_stack_00000048;
  TPZCompMesh *in_stack_00000050;
  TPZAutoPointer<TPZCompMesh> *in_stack_ffffffffffffff70;
  int64_t in_stack_ffffffffffffff78;
  TPZCompMesh *rval;
  TPZManVector<long,_10> *in_stack_ffffffffffffff80;
  TPZAutoPointer<TPZCompMesh> *this_00;
  
  *in_RDI = &PTR__TPZMHMeshControl_025a2ca0;
  TPZAutoPointer<TPZGeoMesh>::TPZAutoPointer
            ((TPZAutoPointer<TPZGeoMesh> *)in_stack_ffffffffffffff70);
  TPZAutoPointer<TPZCompMesh>::TPZAutoPointer(in_stack_ffffffffffffff70);
  TPZAutoPointer<TPZCompMesh>::TPZAutoPointer(in_stack_ffffffffffffff70);
  TPZAutoPointer<TPZCompMesh>::TPZAutoPointer(in_stack_ffffffffffffff70);
  TPZAutoPointer<TPZCompMesh>::TPZAutoPointer(in_stack_ffffffffffffff70);
  *(undefined4 *)(in_RDI + 6) = 1;
  *(undefined4 *)((long)in_RDI + 0x34) = 1;
  *(undefined4 *)(in_RDI + 7) = 4;
  *(undefined4 *)((long)in_RDI + 0x3c) = 3;
  *(undefined4 *)(in_RDI + 8) = 6;
  *(undefined4 *)((long)in_RDI + 0x44) = 0x226;
  *(undefined4 *)(in_RDI + 9) = 0x227;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1f644ba);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1f644cd);
  *(undefined4 *)(in_RDI + 0x16) = 1;
  *(undefined4 *)((long)in_RDI + 0xb4) = 1;
  *(undefined4 *)(in_RDI + 0x17) = 0;
  *(undefined4 *)((long)in_RDI + 0xbc) = 500;
  *(undefined4 *)(in_RDI + 0x18) = 0x1f6;
  *(undefined4 *)((long)in_RDI + 0xc4) = 0x1f5;
  TPZManVector<long,_10>::TPZManVector(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  rval = (TPZCompMesh *)(in_RDI + 0x27);
  in_RDI[0x2b] = 0;
  in_RDI[0x2c] = 0;
  in_RDI[0x29] = 0;
  in_RDI[0x2a] = 0;
  in_RDI[0x27] = 0;
  in_RDI[0x28] = 0;
  std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::map
            ((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
             0x1f64556);
  this_00 = (TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x2d);
  std::
  map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
  ::map((map<long,_std::pair<long,_long>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<long,_long>_>_>_>
         *)0x1f6456c);
  std::
  map<TPZCompMesh_*,_TPZManVector<long,_10>,_std::less<TPZCompMesh_*>,_std::allocator<std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>_>_>
  ::map((map<TPZCompMesh_*,_TPZManVector<long,_10>,_std::less<TPZCompMesh_*>,_std::allocator<std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>_>_>
         *)0x1f64582);
  *(undefined1 *)(in_RDI + 0x39) = 0;
  *(undefined1 *)((long)in_RDI + 0x1c9) = 0;
  *(undefined1 *)((long)in_RDI + 0x1ca) = 0;
  in_RDI[0x3a] = 0xffffffffffffffff;
  in_RDI[0x3b] = 0xffffffffffffffff;
  in_RDI[0x3c] = 0xffffffffffffffff;
  pTVar1 = (TPZGeoMesh *)operator_new(0x2a8);
  TPZGeoMesh::TPZGeoMesh(pTVar1);
  TPZAutoPointer<TPZGeoMesh>::operator=((TPZAutoPointer<TPZGeoMesh> *)this_00,(TPZGeoMesh *)rval);
  pTVar1 = TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 1));
  TPZGeoMesh::SetDimension(pTVar1,in_ESI);
  operator_new(0x918);
  TPZCompMesh::TPZCompMesh(in_stack_00000050,in_stack_00000048,in_stack_00000047);
  TPZAutoPointer<TPZCompMesh>::operator=(this_00,rval);
  operator_new(0x918);
  TPZCompMesh::TPZCompMesh(in_stack_00000050,in_stack_00000048,in_stack_00000047);
  TPZAutoPointer<TPZCompMesh>::operator=(this_00,rval);
  return;
}

Assistant:

TPZMHMeshControl(int dimension) : fProblemType(EScalar), fNState(1), fGeoToMHMDomain(), fMHMtoSubCMesh(),
    fLagrangeAveragePressure(false),
    fHybridize(false), fSwitchLagrangeSign(false), fGlobalSystemSize(-1), fGlobalSystemWithLocalCondensationSize(-1), fNumeq(-1)
    {
        fGMesh = new TPZGeoMesh;
        fGMesh->SetDimension(dimension);
        fCMesh = new TPZCompMesh(fGMesh);
        fPressureFineMesh = new TPZCompMesh(fGMesh);
    }